

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_cursor.cpp
# Opt level: O3

void __thiscall Am_Cursor_Data::~Am_Cursor_Data(Am_Cursor_Data *this)

{
  Cursor_Item *pCVar1;
  Cursor_Item *pCVar2;
  Am_Cursor_Data **ppAVar3;
  Am_Cursor_Data *pAVar4;
  Am_Cursor_Data *pAVar5;
  Cursor_Item *pCVar6;
  
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002e33e0;
  pCVar1 = this->head;
  if (pCVar1 == (Cursor_Item *)0x0) {
    pCVar6 = (Cursor_Item *)0x0;
  }
  else {
    pCVar2 = pCVar1->next;
    pCVar6 = pCVar1;
    while (pCVar2 != (Cursor_Item *)0x0) {
      operator_delete(pCVar6);
      pCVar6 = pCVar1->next;
      this->head = pCVar6;
      pCVar2 = pCVar6->next;
      pCVar1->next = pCVar2;
    }
  }
  operator_delete(pCVar6);
  ppAVar3 = &list;
  if (list != (Am_Cursor_Data *)0x0) {
    pAVar4 = list;
    if (list == this) {
      pAVar5 = (Am_Cursor_Data *)0x0;
    }
    else {
      do {
        pAVar5 = pAVar4;
        pAVar4 = pAVar5->next;
        if (pAVar4 == (Am_Cursor_Data *)0x0) goto LAB_00274914;
      } while (pAVar4 != this);
    }
    if (pAVar5 != (Am_Cursor_Data *)0x0) {
      ppAVar3 = &pAVar5->next;
    }
    *ppAVar3 = pAVar4->next;
  }
LAB_00274914:
  Am_Style::~Am_Style(&this->bg_color);
  Am_Style::~Am_Style(&this->fg_color);
  Am_Image_Array::~Am_Image_Array(&this->mask);
  Am_Image_Array::~Am_Image_Array(&this->image);
  return;
}

Assistant:

Am_Cursor_Data::~Am_Cursor_Data()
{
  // needs to delete the linked list of cursor_items
  Cursor_Item *cl;
  cl = head;
  if (cl)
    while (cl->next) {
      delete head;
      head = cl->next;
      cl->next = cl->next->next;
    }
  delete head;
  remove(this);
}